

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::showEvent(QMessageBox *this,QShowEvent *e)

{
  QMessageBoxPrivate *this_00;
  long in_FS_OFFSET;
  code *local_48;
  undefined8 uStack_40;
  QMessageBox *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_00->clickedButton = (QAbstractButton *)0x0;
  QMessageBoxPrivate::updateSize(this_00);
  local_48 = QFont::strikeOut;
  uStack_40 = 0xaaaaaaaa00000002;
  uStack_30 = 0xaaaaaaaaffffffff;
  local_38 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QDialog::showEvent(&this->super_QDialog,e);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::showEvent(QShowEvent *e)
{
    Q_D(QMessageBox);
    d->clickedButton = nullptr;
    d->updateSize();

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::Alert);
    QAccessible::updateAccessibility(&event);
#endif
#if defined(Q_OS_WIN)
    if (const HMENU systemMenu = qt_getWindowsSystemMenu(this)) {
        EnableMenuItem(systemMenu, SC_CLOSE, d->detectedEscapeButton ?
                       MF_BYCOMMAND|MF_ENABLED : MF_BYCOMMAND|MF_GRAYED);
    }
#endif
    QDialog::showEvent(e);
}